

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::anon_unknown_36::ConcurrencyLimitingHttpClient::attachCounter
          (ConcurrencyLimitingHttpClient *this,Promise<kj::HttpClient::WebSocketResponse> *promise,
          ConnectionCounter *counter)

{
  PromiseNode *pPVar1;
  PromiseArena *pPVar2;
  void *pvVar3;
  SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6646:25)>
  *location;
  void *continuationTracePtr;
  anon_class_8_1_bc7188dc_for_func local_48;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_40;
  code *local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_30;
  
  local_48.counter.parent = (ConnectionCounter)counter->parent;
  counter->parent = (ConcurrencyLimitingHttpClient *)0x0;
  local_38 = kj::_::
             SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6646:25)>
             ::anon_class_8_1_bc7188dc_for_func::operator();
  pPVar1 = (promise->super_PromiseBase).node.ptr;
  pPVar2 = (pPVar1->super_PromiseArenaMember).arena;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)pPVar1 - (long)pPVar2) < 0x28) {
    pvVar3 = operator_new(0x400);
    location = (SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6646:25)>
                *)((long)pvVar3 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::attachCounter(kj::Promise<kj::HttpClient::WebSocketResponse>&&,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)::_lambda(kj::HttpClient::WebSocketResponse&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::attachCounter(kj::Promise<kj::HttpClient::WebSocketResponse>&&,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)::_lambda(kj::HttpClient::WebSocketResponse&&)_1_,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)promise,&local_48,
               &local_38);
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    (pPVar1->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location = (SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6646:25)>
                *)&pPVar1[-3].super_PromiseArenaMember.arena;
    ctor<kj::_::SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::attachCounter(kj::Promise<kj::HttpClient::WebSocketResponse>&&,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)::_lambda(kj::HttpClient::WebSocketResponse&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::attachCounter(kj::Promise<kj::HttpClient::WebSocketResponse>&&,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)::_lambda(kj::HttpClient::WebSocketResponse&&)_1_,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)promise,&local_48,
               &local_38);
    pPVar1[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar2;
  }
  local_40.ptr = (PromiseNode *)0x0;
  (this->super_HttpClient)._vptr_HttpClient = (_func_int **)location;
  local_30.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_30);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_40);
  ConnectionCounter::~ConnectionCounter(&local_48.counter);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

static kj::Promise<WebSocketResponse> attachCounter(kj::Promise<WebSocketResponse>&& promise,
                                                      ConnectionCounter&& counter) {
    return promise.then([counter = kj::mv(counter)](WebSocketResponse&& response) mutable {
      return WebSocketResponse {
        response.statusCode,
        response.statusText,
        response.headers,
        attachCounter(kj::mv(response.webSocketOrBody), kj::mv(counter))
      };
    });
  }